

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O1

void do_protection_heat_cold(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  CClass *this;
  char *txt;
  long lVar5;
  AFFECT_DATA local_90;
  
  iVar3 = get_skill(ch,(int)gsn_protection_heat_cold);
  if (iVar3 != 0) {
    sVar1 = ch->level;
    lVar5 = (long)gsn_protection_heat_cold;
    this = ch->my_class;
    if ((this == (CClass *)0x0) &&
       ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
        (this = ch->pIndexData->my_class, this == (CClass *)0x0)))) {
      this = CClass::GetClass(0);
    }
    iVar4 = CClass::GetIndex(this);
    if (*(short *)(lVar5 * 0x60 + 0x45a788 + (long)iVar4 * 2) <= sVar1) {
      bVar2 = is_affected(ch,(int)gsn_protection_heat_cold);
      if (!bVar2) {
        iVar4 = number_percent();
        if (iVar3 < iVar4) {
          send_to_char("You try to protect yourself from the elements but fail.\n\r",ch);
          check_improve(ch,(int)gsn_protection_heat_cold,false,1);
          return;
        }
        init_affect(&local_90);
        local_90.where = 3;
        local_90.aftype = 1;
        local_90.type = gsn_protection_heat_cold;
        local_90.level = ch->level;
        local_90.bitvector[0] = local_90.bitvector[0] | 0x180;
        local_90.location = 0;
        local_90.modifier = 0;
        local_90.mod_name = 0xc;
        local_90.duration = local_90.level;
        affect_to_char(ch,&local_90);
        send_to_char("You are protected from the elements.\n\r",ch);
        check_improve(ch,(int)gsn_protection_heat_cold,true,1);
        return;
      }
      txt = "You are already protected from the elements.\n\r";
      goto LAB_0029f926;
    }
  }
  txt = "You don\'t know how to protect yourself from the elements.\n\r";
LAB_0029f926:
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_protection_heat_cold(CHAR_DATA *ch, char *argument)
{
	AFFECT_DATA af;
	int chance;
	chance = get_skill(ch, gsn_protection_heat_cold);

	if (chance == 0 || ch->level < skill_table[gsn_protection_heat_cold].skill_level[ch->Class()->GetIndex()])
	{
		send_to_char("You don't know how to protect yourself from the elements.\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_protection_heat_cold))
	{
		send_to_char("You are already protected from the elements.\n\r", ch);
		return;
	}

	if (number_percent() > chance)
	{
		send_to_char("You try to protect yourself from the elements but fail.\n\r", ch);
		check_improve(ch, gsn_protection_heat_cold, false, 1);
		return;
	}

	init_affect(&af);
	af.where = TO_RESIST;
	af.aftype = AFT_SKILL;
	af.type = gsn_protection_heat_cold;
	af.level = ch->level;
	af.modifier = 0;
	af.duration = ch->level;

	SET_BIT(af.bitvector, RES_FIRE);
	SET_BIT(af.bitvector, RES_COLD);

	af.location = 0;
	af.mod_name = MOD_RESISTANCE;
	affect_to_char(ch, &af);

	send_to_char("You are protected from the elements.\n\r", ch);
	check_improve(ch, gsn_protection_heat_cold, true, 1);
}